

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::SimdLaneOpExpr,_std::default_delete<wabt::SimdLaneOpExpr>_> __thiscall
wabt::MakeUnique<wabt::SimdLaneOpExpr,wabt::Opcode&,unsigned_long&>
          (wabt *this,Opcode *args,unsigned_long *args_1)

{
  uint64_t val;
  SimdLaneOpExpr *this_00;
  Location local_48;
  Opcode local_24;
  uint64_t *local_20;
  unsigned_long *args_local_1;
  Opcode *args_local;
  
  local_20 = args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (Opcode *)this;
  this_00 = (SimdLaneOpExpr *)operator_new(0x48);
  local_24.enum_ = (Enum)*args_local_1;
  val = *local_20;
  Location::Location(&local_48);
  SimdLaneOpExpr::SimdLaneOpExpr(this_00,local_24,val,&local_48);
  std::unique_ptr<wabt::SimdLaneOpExpr,std::default_delete<wabt::SimdLaneOpExpr>>::
  unique_ptr<std::default_delete<wabt::SimdLaneOpExpr>,void>
            ((unique_ptr<wabt::SimdLaneOpExpr,std::default_delete<wabt::SimdLaneOpExpr>> *)this,
             this_00);
  return (__uniq_ptr_data<wabt::SimdLaneOpExpr,_std::default_delete<wabt::SimdLaneOpExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::SimdLaneOpExpr,_std::default_delete<wabt::SimdLaneOpExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}